

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_drl_idx(FRAME_CONTEXT *ec_ctx,DecoderCodingBlock *dcb,MB_MODE_INFO *mbmi,aom_reader *r)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  long in_RDX;
  long in_RSI;
  int drl_idx_1;
  uint8_t drl_ctx_1;
  int idx_1;
  int drl_idx;
  uint8_t drl_ctx;
  int idx;
  uint8_t ref_frame_type;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  
  bVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(ushort *)(in_RDX + 0xa7) = *(ushort *)(in_RDX + 0xa7) & 0xffcf;
  if ((*(char *)(in_RDX + 2) == '\x10') || (*(char *)(in_RDX + 2) == '\x18')) {
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      if (local_30 + 1 < (int)(uint)*(byte *)(in_RSI + 0x3b26 + (ulong)bVar1)) {
        av1_drl_ctx((uint16_t *)(in_RSI + 0x27b8 + (ulong)bVar1 * 0x10),local_30);
        iVar3 = aom_read_symbol_((aom_reader *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (aom_cdf_prob *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        *(ushort *)(in_RDX + 0xa7) =
             *(ushort *)(in_RDX + 0xa7) & 0xffcf | ((byte)((char)local_30 + (char)iVar3) & 3) << 4;
        if (iVar3 == 0) {
          return;
        }
      }
    }
  }
  iVar3 = have_nearmv_in_inter_mode(*(PREDICTION_MODE *)(in_RDX + 2));
  if (iVar3 != 0) {
    for (iVar3 = 1; iVar3 < 3; iVar3 = iVar3 + 1) {
      if (iVar3 + 1 < (int)(uint)*(byte *)(in_RSI + 0x3b26 + (ulong)bVar1)) {
        uVar2 = av1_drl_ctx((uint16_t *)(in_RSI + 0x27b8 + (ulong)bVar1 * 0x10),iVar3);
        in_stack_ffffffffffffffc0 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffffc0);
        in_stack_ffffffffffffffbc =
             aom_read_symbol_((aom_reader *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                              (aom_cdf_prob *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        *(ushort *)(in_RDX + 0xa7) =
             *(ushort *)(in_RDX + 0xa7) & 0xffcf |
             ((byte)(((char)iVar3 + (char)in_stack_ffffffffffffffbc) - 1) & 3) << 4;
        if (in_stack_ffffffffffffffbc == 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void read_drl_idx(FRAME_CONTEXT *ec_ctx, DecoderCodingBlock *dcb,
                         MB_MODE_INFO *mbmi, aom_reader *r) {
  MACROBLOCKD *const xd = &dcb->xd;
  uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
  mbmi->ref_mv_idx = 0;
  if (mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV) {
    for (int idx = 0; idx < 2; ++idx) {
      if (dcb->ref_mv_count[ref_frame_type] > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(xd->weight[ref_frame_type], idx);
        int drl_idx = aom_read_symbol(r, ec_ctx->drl_cdf[drl_ctx], 2, ACCT_STR);
        mbmi->ref_mv_idx = idx + drl_idx;
        if (!drl_idx) return;
      }
    }
  }
  if (have_nearmv_in_inter_mode(mbmi->mode)) {
    // Offset the NEARESTMV mode.
    // TODO(jingning): Unify the two syntax decoding loops after the NEARESTMV
    // mode is factored in.
    for (int idx = 1; idx < 3; ++idx) {
      if (dcb->ref_mv_count[ref_frame_type] > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(xd->weight[ref_frame_type], idx);
        int drl_idx = aom_read_symbol(r, ec_ctx->drl_cdf[drl_ctx], 2, ACCT_STR);
        mbmi->ref_mv_idx = idx + drl_idx - 1;
        if (!drl_idx) return;
      }
    }
  }
}